

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O3

bool __thiscall
Part_Key_Offset_Store_Data::operator==(Part_Key_Offset_Store_Data *this,Am_Wrapper *test_value)

{
  Am_ID_Tag AVar1;
  int iVar2;
  
  AVar1 = id;
  iVar2 = (**(test_value->super_Am_Registered_Type)._vptr_Am_Registered_Type)(test_value);
  if (AVar1 == (Am_ID_Tag)iVar2) {
    if ((Part_Key_Offset_Store_Data *)test_value == this) {
      return true;
    }
    if (((*(short *)&test_value->field_0xe == *(short *)&(this->super_Am_Wrapper).field_0xe) &&
        (*(short *)&test_value->field_0xc == *(short *)&(this->super_Am_Wrapper).field_0xc)) &&
       (*(int *)&test_value[1].super_Am_Registered_Type._vptr_Am_Registered_Type == this->offset)) {
      return (bool)(-(this->multiplier ==
                     *(float *)((long)&test_value[1].super_Am_Registered_Type.
                                       _vptr_Am_Registered_Type + 4)) & 1);
    }
  }
  return false;
}

Assistant:

static Am_Value
offset_from_part_procedure(Am_Object &self)
{
  Am_Value value;
  Part_Key_Offset_Store_Data *store =
      (Part_Key_Offset_Store_Data *)Am_Object_Advanced::Get_Context()
          ->Get_Data();
  value = self.Get_Object(store->part).Get(store->key);
  store->Release();
  modify_value(value, store->offset, store->multiplier);
  return value;
}